

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O3

void do_room_or_subroom(level *lev,mkroom *croom,int lowx,int lowy,int hix,int hiy,boolean lit,
                       schar rtype,boolean special,boolean is_room)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 *puVar29;
  int y1;
  int x2;
  int x1;
  int iVar30;
  int iVar31;
  uint uVar32;
  int iVar33;
  int y2;
  schar sVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  schar *psVar38;
  long lVar39;
  undefined1 *puVar40;
  schar *psVar41;
  undefined1 auVar42 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  int iVar64;
  int iVar65;
  undefined1 auVar62 [16];
  int iVar66;
  undefined1 auVar63 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  int iVar80;
  int iVar84;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  
  x1 = lowx + (uint)(lowx == 0);
  y1 = lowy + (uint)(lowy == 0);
  x2 = 0x4e;
  if (hix < 0x4e) {
    x2 = hix;
  }
  y2 = 0x13;
  if (hiy < 0x13) {
    y2 = hiy;
  }
  if (lit == '\0') {
    sVar34 = '\0';
  }
  else {
    sVar34 = '\x01';
    if (x1 + -1 <= x2 + 1) {
      uVar32 = y1 - 1;
      uVar37 = 0;
      if (0 < (int)uVar32) {
        uVar37 = (ulong)uVar32;
      }
      lVar35 = (long)(x1 + -1);
      puVar29 = &lev->locations[lVar35][uVar37].field_0x6;
      do {
        puVar40 = puVar29;
        iVar33 = (y2 - y1) + 3;
        if ((int)uVar32 <= y2 + 1) {
          do {
            puVar40[1] = puVar40[1] | 4;
            iVar33 = iVar33 + -1;
            puVar40 = puVar40 + 0xc;
          } while (iVar33 != 0);
        }
        lVar35 = lVar35 + 1;
        puVar29 = puVar29 + 0xfc;
      } while (x2 + 2 != (int)lVar35);
    }
  }
  croom->rlit = sVar34;
  croom->lx = (schar)x1;
  croom->hx = (schar)x2;
  croom->ly = (schar)y1;
  croom->hy = (schar)y2;
  croom->rtype = rtype;
  croom->doorct = '\0';
  croom->fdoor = (schar)lev->doorindex;
  croom->nsubrooms = '\0';
  croom->irregular = '\0';
  croom->sbrooms[0] = (mkroom *)0x0;
  if (special == '\0') {
    iVar31 = x1 + -1;
    iVar33 = x2 + 1;
    if (iVar31 <= iVar33) {
      lVar35 = (long)iVar31;
      iVar30 = y1 + -1;
      lVar36 = (long)((y2 - y1) + 2);
      puVar29 = &lev->locations[lVar35][iVar30].field_0x6;
      do {
        puVar40 = puVar29;
        lVar39 = (long)iVar30;
        if (iVar30 <= y2 + 1) {
          do {
            puVar40[-2] = '\x02';
            puVar40[1] = puVar40[1] | 2;
            lVar39 = lVar39 + lVar36;
            puVar40 = puVar40 + lVar36 * 0xc;
          } while (lVar39 <= y2 + 1);
        }
        lVar35 = lVar35 + 1;
        puVar29 = puVar29 + 0xfc;
      } while (x2 + 2 != (int)lVar35);
      if (iVar31 <= iVar33) {
        lVar35 = (long)iVar31;
        lVar36 = (long)((x2 - x1) + 2);
        puVar29 = &lev->locations[lVar35][y1].field_0x6;
        do {
          puVar40 = puVar29;
          iVar30 = (y2 - y1) + 1;
          if (y1 <= y2) {
            do {
              puVar40[-2] = '\x01';
              puVar40[1] = puVar40[1] & 0xfd;
              puVar40 = puVar40 + 0xc;
              iVar30 = iVar30 + -1;
            } while (iVar30 != 0);
          }
          lVar35 = lVar35 + lVar36;
          puVar29 = puVar29 + lVar36 * 0xfc;
        } while (lVar35 <= iVar33);
      }
    }
    auVar28 = _DAT_002adfe0;
    auVar27 = _DAT_002adfd0;
    auVar26 = _DAT_002adfc0;
    auVar25 = _DAT_002adfb0;
    auVar24 = _DAT_002adfa0;
    auVar23 = _DAT_002ab9e0;
    auVar22 = _DAT_002ab9d0;
    if (x1 <= x2) {
      lVar35 = (long)x1;
      uVar32 = y2 - y1;
      auVar42._4_4_ = 0;
      auVar42._0_4_ = uVar32;
      auVar42._8_4_ = uVar32;
      auVar42._12_4_ = 0;
      psVar38 = &lev->locations[lVar35][(long)y1 + 0xf].typ;
      do {
        if (y1 <= y2) {
          uVar37 = 0;
          psVar41 = psVar38;
          do {
            auVar60._8_4_ = (int)uVar37;
            auVar60._0_8_ = uVar37;
            auVar60._12_4_ = (int)(uVar37 >> 0x20);
            auVar62 = auVar42 ^ auVar23;
            auVar67 = (auVar60 | auVar22) ^ auVar23;
            iVar30 = auVar62._0_4_;
            iVar80 = -(uint)(iVar30 < auVar67._0_4_);
            iVar64 = auVar62._4_4_;
            auVar69._4_4_ = -(uint)(iVar64 < auVar67._4_4_);
            iVar65 = auVar62._8_4_;
            iVar84 = -(uint)(iVar65 < auVar67._8_4_);
            iVar66 = auVar62._12_4_;
            auVar69._12_4_ = -(uint)(iVar66 < auVar67._12_4_);
            auVar43._4_4_ = iVar80;
            auVar43._0_4_ = iVar80;
            auVar43._8_4_ = iVar84;
            auVar43._12_4_ = iVar84;
            auVar43 = pshuflw(in_XMM1,auVar43,0xe8);
            auVar68._4_4_ = -(uint)(auVar67._4_4_ == iVar64);
            auVar68._12_4_ = -(uint)(auVar67._12_4_ == iVar66);
            auVar68._0_4_ = auVar68._4_4_;
            auVar68._8_4_ = auVar68._12_4_;
            auVar52 = pshuflw(in_XMM2,auVar68,0xe8);
            auVar69._0_4_ = auVar69._4_4_;
            auVar69._8_4_ = auVar69._12_4_;
            auVar67 = pshuflw(auVar43,auVar69,0xe8);
            auVar62._8_4_ = 0xffffffff;
            auVar62._0_8_ = 0xffffffffffffffff;
            auVar62._12_4_ = 0xffffffff;
            auVar62 = (auVar67 | auVar52 & auVar43) ^ auVar62;
            auVar62 = packssdw(auVar62,auVar62);
            if ((auVar62 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              psVar41[-0xb4] = 0x19;
            }
            auVar52._4_4_ = iVar80;
            auVar52._0_4_ = iVar80;
            auVar52._8_4_ = iVar84;
            auVar52._12_4_ = iVar84;
            auVar69 = auVar68 & auVar52 | auVar69;
            auVar62 = packssdw(auVar69,auVar69);
            auVar67._8_4_ = 0xffffffff;
            auVar67._0_8_ = 0xffffffffffffffff;
            auVar67._12_4_ = 0xffffffff;
            auVar62 = packssdw(auVar62 ^ auVar67,auVar62 ^ auVar67);
            auVar62 = packsswb(auVar62,auVar62);
            if ((auVar62._0_4_ >> 8 & 1) != 0) {
              psVar41[-0xa8] = 0x19;
            }
            auVar62 = (auVar60 | auVar28) ^ auVar23;
            auVar53._0_4_ = -(uint)(iVar30 < auVar62._0_4_);
            auVar53._4_4_ = -(uint)(iVar64 < auVar62._4_4_);
            auVar53._8_4_ = -(uint)(iVar65 < auVar62._8_4_);
            auVar53._12_4_ = -(uint)(iVar66 < auVar62._12_4_);
            auVar70._4_4_ = auVar53._0_4_;
            auVar70._0_4_ = auVar53._0_4_;
            auVar70._8_4_ = auVar53._8_4_;
            auVar70._12_4_ = auVar53._8_4_;
            iVar80 = -(uint)(auVar62._4_4_ == iVar64);
            iVar84 = -(uint)(auVar62._12_4_ == iVar66);
            auVar10._4_4_ = iVar80;
            auVar10._0_4_ = iVar80;
            auVar10._8_4_ = iVar84;
            auVar10._12_4_ = iVar84;
            auVar81._4_4_ = auVar53._4_4_;
            auVar81._0_4_ = auVar53._4_4_;
            auVar81._8_4_ = auVar53._12_4_;
            auVar81._12_4_ = auVar53._12_4_;
            auVar62 = auVar10 & auVar70 | auVar81;
            auVar62 = packssdw(auVar62,auVar62);
            auVar1._8_4_ = 0xffffffff;
            auVar1._0_8_ = 0xffffffffffffffff;
            auVar1._12_4_ = 0xffffffff;
            auVar62 = packssdw(auVar62 ^ auVar1,auVar62 ^ auVar1);
            auVar62 = packsswb(auVar62,auVar62);
            if ((auVar62._0_4_ >> 0x10 & 1) != 0) {
              psVar41[-0x9c] = 0x19;
            }
            auVar62 = pshufhw(auVar62,auVar70,0x84);
            auVar11._4_4_ = iVar80;
            auVar11._0_4_ = iVar80;
            auVar11._8_4_ = iVar84;
            auVar11._12_4_ = iVar84;
            auVar67 = pshufhw(auVar53,auVar11,0x84);
            auVar43 = pshufhw(auVar62,auVar81,0x84);
            auVar44._8_4_ = 0xffffffff;
            auVar44._0_8_ = 0xffffffffffffffff;
            auVar44._12_4_ = 0xffffffff;
            auVar44 = (auVar43 | auVar67 & auVar62) ^ auVar44;
            auVar62 = packssdw(auVar44,auVar44);
            auVar62 = packsswb(auVar62,auVar62);
            if ((auVar62._0_4_ >> 0x18 & 1) != 0) {
              psVar41[-0x90] = 0x19;
            }
            auVar62 = (auVar60 | auVar27) ^ auVar23;
            auVar54._0_4_ = -(uint)(iVar30 < auVar62._0_4_);
            auVar54._4_4_ = -(uint)(iVar64 < auVar62._4_4_);
            auVar54._8_4_ = -(uint)(iVar65 < auVar62._8_4_);
            auVar54._12_4_ = -(uint)(iVar66 < auVar62._12_4_);
            auVar12._4_4_ = auVar54._0_4_;
            auVar12._0_4_ = auVar54._0_4_;
            auVar12._8_4_ = auVar54._8_4_;
            auVar12._12_4_ = auVar54._8_4_;
            auVar67 = pshuflw(auVar81,auVar12,0xe8);
            auVar45._0_4_ = -(uint)(auVar62._0_4_ == iVar30);
            auVar45._4_4_ = -(uint)(auVar62._4_4_ == iVar64);
            auVar45._8_4_ = -(uint)(auVar62._8_4_ == iVar65);
            auVar45._12_4_ = -(uint)(auVar62._12_4_ == iVar66);
            auVar71._4_4_ = auVar45._4_4_;
            auVar71._0_4_ = auVar45._4_4_;
            auVar71._8_4_ = auVar45._12_4_;
            auVar71._12_4_ = auVar45._12_4_;
            auVar62 = pshuflw(auVar45,auVar71,0xe8);
            auVar72._4_4_ = auVar54._4_4_;
            auVar72._0_4_ = auVar54._4_4_;
            auVar72._8_4_ = auVar54._12_4_;
            auVar72._12_4_ = auVar54._12_4_;
            auVar43 = pshuflw(auVar54,auVar72,0xe8);
            auVar2._8_4_ = 0xffffffff;
            auVar2._0_8_ = 0xffffffffffffffff;
            auVar2._12_4_ = 0xffffffff;
            auVar62 = packssdw(auVar62 & auVar67,(auVar43 | auVar62 & auVar67) ^ auVar2);
            auVar62 = packsswb(auVar62,auVar62);
            if ((auVar62 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              psVar41[-0x84] = 0x19;
            }
            auVar13._4_4_ = auVar54._0_4_;
            auVar13._0_4_ = auVar54._0_4_;
            auVar13._8_4_ = auVar54._8_4_;
            auVar13._12_4_ = auVar54._8_4_;
            auVar72 = auVar71 & auVar13 | auVar72;
            auVar43 = packssdw(auVar72,auVar72);
            auVar3._8_4_ = 0xffffffff;
            auVar3._0_8_ = 0xffffffffffffffff;
            auVar3._12_4_ = 0xffffffff;
            auVar62 = packssdw(auVar62,auVar43 ^ auVar3);
            auVar62 = packsswb(auVar62,auVar62);
            if ((auVar62._4_2_ >> 8 & 1) != 0) {
              psVar41[-0x78] = 0x19;
            }
            auVar62 = (auVar60 | auVar26) ^ auVar23;
            auVar55._0_4_ = -(uint)(iVar30 < auVar62._0_4_);
            auVar55._4_4_ = -(uint)(iVar64 < auVar62._4_4_);
            auVar55._8_4_ = -(uint)(iVar65 < auVar62._8_4_);
            auVar55._12_4_ = -(uint)(iVar66 < auVar62._12_4_);
            auVar73._4_4_ = auVar55._0_4_;
            auVar73._0_4_ = auVar55._0_4_;
            auVar73._8_4_ = auVar55._8_4_;
            auVar73._12_4_ = auVar55._8_4_;
            iVar80 = -(uint)(auVar62._4_4_ == iVar64);
            iVar84 = -(uint)(auVar62._12_4_ == iVar66);
            auVar14._4_4_ = iVar80;
            auVar14._0_4_ = iVar80;
            auVar14._8_4_ = iVar84;
            auVar14._12_4_ = iVar84;
            auVar82._4_4_ = auVar55._4_4_;
            auVar82._0_4_ = auVar55._4_4_;
            auVar82._8_4_ = auVar55._12_4_;
            auVar82._12_4_ = auVar55._12_4_;
            auVar62 = auVar14 & auVar73 | auVar82;
            auVar62 = packssdw(auVar62,auVar62);
            auVar4._8_4_ = 0xffffffff;
            auVar4._0_8_ = 0xffffffffffffffff;
            auVar4._12_4_ = 0xffffffff;
            auVar62 = packssdw(auVar62 ^ auVar4,auVar62 ^ auVar4);
            auVar62 = packsswb(auVar62,auVar62);
            if ((auVar62 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              psVar41[-0x6c] = 0x19;
            }
            auVar62 = pshufhw(auVar62,auVar73,0x84);
            auVar15._4_4_ = iVar80;
            auVar15._0_4_ = iVar80;
            auVar15._8_4_ = iVar84;
            auVar15._12_4_ = iVar84;
            auVar67 = pshufhw(auVar55,auVar15,0x84);
            auVar43 = pshufhw(auVar62,auVar82,0x84);
            auVar46._8_4_ = 0xffffffff;
            auVar46._0_8_ = 0xffffffffffffffff;
            auVar46._12_4_ = 0xffffffff;
            auVar46 = (auVar43 | auVar67 & auVar62) ^ auVar46;
            auVar62 = packssdw(auVar46,auVar46);
            auVar62 = packsswb(auVar62,auVar62);
            if ((auVar62._6_2_ >> 8 & 1) != 0) {
              psVar41[-0x60] = 0x19;
            }
            auVar62 = (auVar60 | auVar25) ^ auVar23;
            auVar56._0_4_ = -(uint)(iVar30 < auVar62._0_4_);
            auVar56._4_4_ = -(uint)(iVar64 < auVar62._4_4_);
            auVar56._8_4_ = -(uint)(iVar65 < auVar62._8_4_);
            auVar56._12_4_ = -(uint)(iVar66 < auVar62._12_4_);
            auVar16._4_4_ = auVar56._0_4_;
            auVar16._0_4_ = auVar56._0_4_;
            auVar16._8_4_ = auVar56._8_4_;
            auVar16._12_4_ = auVar56._8_4_;
            auVar67 = pshuflw(auVar82,auVar16,0xe8);
            auVar47._0_4_ = -(uint)(auVar62._0_4_ == iVar30);
            auVar47._4_4_ = -(uint)(auVar62._4_4_ == iVar64);
            auVar47._8_4_ = -(uint)(auVar62._8_4_ == iVar65);
            auVar47._12_4_ = -(uint)(auVar62._12_4_ == iVar66);
            auVar74._4_4_ = auVar47._4_4_;
            auVar74._0_4_ = auVar47._4_4_;
            auVar74._8_4_ = auVar47._12_4_;
            auVar74._12_4_ = auVar47._12_4_;
            auVar62 = pshuflw(auVar47,auVar74,0xe8);
            auVar75._4_4_ = auVar56._4_4_;
            auVar75._0_4_ = auVar56._4_4_;
            auVar75._8_4_ = auVar56._12_4_;
            auVar75._12_4_ = auVar56._12_4_;
            auVar43 = pshuflw(auVar56,auVar75,0xe8);
            auVar57._8_4_ = 0xffffffff;
            auVar57._0_8_ = 0xffffffffffffffff;
            auVar57._12_4_ = 0xffffffff;
            auVar57 = (auVar43 | auVar62 & auVar67) ^ auVar57;
            auVar43 = packssdw(auVar57,auVar57);
            auVar62 = packsswb(auVar62 & auVar67,auVar43);
            if ((auVar62 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              psVar41[-0x54] = 0x19;
            }
            auVar17._4_4_ = auVar56._0_4_;
            auVar17._0_4_ = auVar56._0_4_;
            auVar17._8_4_ = auVar56._8_4_;
            auVar17._12_4_ = auVar56._8_4_;
            auVar75 = auVar74 & auVar17 | auVar75;
            auVar43 = packssdw(auVar75,auVar75);
            auVar5._8_4_ = 0xffffffff;
            auVar5._0_8_ = 0xffffffffffffffff;
            auVar5._12_4_ = 0xffffffff;
            auVar43 = packssdw(auVar43 ^ auVar5,auVar43 ^ auVar5);
            auVar62 = packsswb(auVar62,auVar43);
            if ((auVar62._8_2_ >> 8 & 1) != 0) {
              psVar41[-0x48] = 0x19;
            }
            auVar62 = (auVar60 | auVar24) ^ auVar23;
            auVar58._0_4_ = -(uint)(iVar30 < auVar62._0_4_);
            auVar58._4_4_ = -(uint)(iVar64 < auVar62._4_4_);
            auVar58._8_4_ = -(uint)(iVar65 < auVar62._8_4_);
            auVar58._12_4_ = -(uint)(iVar66 < auVar62._12_4_);
            auVar76._4_4_ = auVar58._0_4_;
            auVar76._0_4_ = auVar58._0_4_;
            auVar76._8_4_ = auVar58._8_4_;
            auVar76._12_4_ = auVar58._8_4_;
            iVar80 = -(uint)(auVar62._4_4_ == iVar64);
            iVar84 = -(uint)(auVar62._12_4_ == iVar66);
            auVar18._4_4_ = iVar80;
            auVar18._0_4_ = iVar80;
            auVar18._8_4_ = iVar84;
            auVar18._12_4_ = iVar84;
            auVar83._4_4_ = auVar58._4_4_;
            auVar83._0_4_ = auVar58._4_4_;
            auVar83._8_4_ = auVar58._12_4_;
            auVar83._12_4_ = auVar58._12_4_;
            auVar62 = auVar18 & auVar76 | auVar83;
            auVar62 = packssdw(auVar62,auVar62);
            auVar6._8_4_ = 0xffffffff;
            auVar6._0_8_ = 0xffffffffffffffff;
            auVar6._12_4_ = 0xffffffff;
            auVar62 = packssdw(auVar62 ^ auVar6,auVar62 ^ auVar6);
            auVar62 = packsswb(auVar62,auVar62);
            if ((auVar62 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              psVar41[-0x3c] = 0x19;
            }
            auVar62 = pshufhw(auVar62,auVar76,0x84);
            auVar19._4_4_ = iVar80;
            auVar19._0_4_ = iVar80;
            auVar19._8_4_ = iVar84;
            auVar19._12_4_ = iVar84;
            auVar67 = pshufhw(auVar58,auVar19,0x84);
            auVar43 = pshufhw(auVar62,auVar83,0x84);
            auVar48._8_4_ = 0xffffffff;
            auVar48._0_8_ = 0xffffffffffffffff;
            auVar48._12_4_ = 0xffffffff;
            auVar48 = (auVar43 | auVar67 & auVar62) ^ auVar48;
            auVar62 = packssdw(auVar48,auVar48);
            auVar62 = packsswb(auVar62,auVar62);
            if ((auVar62._10_2_ >> 8 & 1) != 0) {
              psVar41[-0x30] = 0x19;
            }
            auVar62 = (auVar60 | _DAT_002adf90) ^ auVar23;
            auVar59._0_4_ = -(uint)(iVar30 < auVar62._0_4_);
            auVar59._4_4_ = -(uint)(iVar64 < auVar62._4_4_);
            auVar59._8_4_ = -(uint)(iVar65 < auVar62._8_4_);
            auVar59._12_4_ = -(uint)(iVar66 < auVar62._12_4_);
            auVar20._4_4_ = auVar59._0_4_;
            auVar20._0_4_ = auVar59._0_4_;
            auVar20._8_4_ = auVar59._8_4_;
            auVar20._12_4_ = auVar59._8_4_;
            auVar67 = pshuflw(auVar83,auVar20,0xe8);
            auVar49._0_4_ = -(uint)(auVar62._0_4_ == iVar30);
            auVar49._4_4_ = -(uint)(auVar62._4_4_ == iVar64);
            auVar49._8_4_ = -(uint)(auVar62._8_4_ == iVar65);
            auVar49._12_4_ = -(uint)(auVar62._12_4_ == iVar66);
            auVar77._4_4_ = auVar49._4_4_;
            auVar77._0_4_ = auVar49._4_4_;
            auVar77._8_4_ = auVar49._12_4_;
            auVar77._12_4_ = auVar49._12_4_;
            auVar62 = pshuflw(auVar49,auVar77,0xe8);
            auVar78._4_4_ = auVar59._4_4_;
            auVar78._0_4_ = auVar59._4_4_;
            auVar78._8_4_ = auVar59._12_4_;
            auVar78._12_4_ = auVar59._12_4_;
            auVar43 = pshuflw(auVar59,auVar78,0xe8);
            auVar7._8_4_ = 0xffffffff;
            auVar7._0_8_ = 0xffffffffffffffff;
            auVar7._12_4_ = 0xffffffff;
            auVar62 = packssdw(auVar62 & auVar67,(auVar43 | auVar62 & auVar67) ^ auVar7);
            auVar62 = packsswb(auVar62,auVar62);
            if ((auVar62 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              psVar41[-0x24] = 0x19;
            }
            auVar21._4_4_ = auVar59._0_4_;
            auVar21._0_4_ = auVar59._0_4_;
            auVar21._8_4_ = auVar59._8_4_;
            auVar21._12_4_ = auVar59._8_4_;
            auVar78 = auVar77 & auVar21 | auVar78;
            auVar43 = packssdw(auVar78,auVar78);
            auVar8._8_4_ = 0xffffffff;
            auVar8._0_8_ = 0xffffffffffffffff;
            auVar8._12_4_ = 0xffffffff;
            auVar62 = packssdw(auVar62,auVar43 ^ auVar8);
            auVar62 = packsswb(auVar62,auVar62);
            if ((auVar62._12_2_ >> 8 & 1) != 0) {
              psVar41[-0x18] = 0x19;
            }
            auVar62 = (auVar60 | _DAT_002adf80) ^ auVar23;
            auVar50._0_4_ = -(uint)(iVar30 < auVar62._0_4_);
            auVar50._4_4_ = -(uint)(iVar64 < auVar62._4_4_);
            auVar50._8_4_ = -(uint)(iVar65 < auVar62._8_4_);
            auVar50._12_4_ = -(uint)(iVar66 < auVar62._12_4_);
            auVar79._4_4_ = auVar50._0_4_;
            auVar79._0_4_ = auVar50._0_4_;
            auVar79._8_4_ = auVar50._8_4_;
            auVar79._12_4_ = auVar50._8_4_;
            auVar61._4_4_ = -(uint)(auVar62._4_4_ == iVar64);
            auVar61._12_4_ = -(uint)(auVar62._12_4_ == iVar66);
            auVar61._0_4_ = auVar61._4_4_;
            auVar61._8_4_ = auVar61._12_4_;
            auVar63._4_4_ = auVar50._4_4_;
            auVar63._0_4_ = auVar50._4_4_;
            auVar63._8_4_ = auVar50._12_4_;
            auVar63._12_4_ = auVar50._12_4_;
            auVar43 = auVar61 & auVar79 | auVar63;
            auVar62 = packssdw(auVar50,auVar43);
            auVar9._8_4_ = 0xffffffff;
            auVar9._0_8_ = 0xffffffffffffffff;
            auVar9._12_4_ = 0xffffffff;
            auVar62 = packssdw(auVar62 ^ auVar9,auVar62 ^ auVar9);
            auVar62 = packsswb(auVar62,auVar62);
            if ((auVar62 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              psVar41[-0xc] = 0x19;
            }
            auVar62 = pshufhw(auVar62,auVar79,0x84);
            auVar43 = pshufhw(auVar43,auVar61,0x84);
            in_XMM2 = auVar43 & auVar62;
            auVar62 = pshufhw(auVar62,auVar63,0x84);
            auVar51._8_4_ = 0xffffffff;
            auVar51._0_8_ = 0xffffffffffffffff;
            auVar51._12_4_ = 0xffffffff;
            auVar51 = (auVar62 | in_XMM2) ^ auVar51;
            auVar62 = packssdw(auVar51,auVar51);
            in_XMM1 = packsswb(auVar62,auVar62);
            if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
              *psVar41 = '\x19';
            }
            uVar37 = uVar37 + 0x10;
            psVar41 = psVar41 + 0xc0;
          } while (((ulong)uVar32 + 0x10 & 0xfffffffffffffff0) != uVar37);
        }
        lVar35 = lVar35 + 1;
        psVar38 = psVar38 + 0xfc;
      } while (iVar33 != (int)lVar35);
    }
    if (is_room != '\0') {
      y1 = y1 + -1;
      lev->locations[iVar31][y1].typ = '\x03';
      lev->locations[iVar33][y1].typ = '\x04';
      y2 = y2 + 1;
      lev->locations[iVar31][y2].typ = '\x05';
      lev->locations[iVar33][y2].typ = '\x06';
      x1 = iVar31;
      x2 = iVar33;
    }
    wallification(lev,x1,y1,x2,y2);
    return;
  }
  return;
}

Assistant:

static void do_room_or_subroom(struct level *lev,
			       struct mkroom *croom,
			       int lowx, int lowy,
			       int hix, int hiy,
			       boolean lit,
			       schar rtype,
			       boolean special,
			       boolean is_room)
{
	int x, y;
	struct rm *loc;

	/* locations might bump level edges in wall-less rooms */
	/* add/subtract 1 to allow for edge locations */
	if (!lowx) lowx++;
	if (!lowy) lowy++;
	if (hix >= COLNO-1) hix = COLNO-2;
	if (hiy >= ROWNO-1) hiy = ROWNO-2;

	if (lit) {
		for (x = lowx-1; x <= hix+1; x++) {
			loc = &lev->locations[x][max(lowy-1,0)];
			for (y = lowy-1; y <= hiy+1; y++)
				loc++->lit = 1;
		}
		croom->rlit = 1;
	} else
		croom->rlit = 0;

	croom->lx = lowx;
	croom->hx = hix;
	croom->ly = lowy;
	croom->hy = hiy;
	croom->rtype = rtype;
	croom->doorct = 0;
	/* if we're not making a vault, lev->doorindex will still be 0
	 * if we are, we'll have problems adding niches to the previous room
	 * unless fdoor is at least doorindex
	 */
	croom->fdoor = lev->doorindex;
	croom->irregular = FALSE;

	croom->nsubrooms = 0;
	croom->sbrooms[0] = NULL;
	if (!special) {
	    for (x = lowx-1; x <= hix+1; x++)
		for (y = lowy-1; y <= hiy+1; y += (hiy-lowy+2)) {
		    lev->locations[x][y].typ = HWALL;
		    lev->locations[x][y].horizontal = 1;	/* For open/secret doors. */
		}
	    for (x = lowx-1; x <= hix+1; x += (hix-lowx+2))
		for (y = lowy; y <= hiy; y++) {
		    lev->locations[x][y].typ = VWALL;
		    lev->locations[x][y].horizontal = 0;	/* For open/secret doors. */
		}
	    for (x = lowx; x <= hix; x++) {
		loc = &lev->locations[x][lowy];
		for (y = lowy; y <= hiy; y++)
		    loc++->typ = ROOM;
	    }
	    if (is_room) {
		lev->locations[lowx-1][lowy-1].typ = TLCORNER;
		lev->locations[hix+1][lowy-1].typ = TRCORNER;
		lev->locations[lowx-1][hiy+1].typ = BLCORNER;
		lev->locations[hix+1][hiy+1].typ = BRCORNER;
		wallification(lev, lowx-1, lowy-1, hix+1, hiy+1);
	    } else {	/* a subroom */
		wallification(lev, lowx, lowy, hix, hiy);	/* this is bugs */
	    }
	}
}